

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::PumpSink>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::PumpSink>_>
              *this,void *pointer)

{
  StringPtr cancelReason;
  
  if (pointer != (void *)0x0) {
    cancelReason.content.size_ = 0x1d;
    cancelReason.content.ptr = "This pump has been canceled.";
    Canceler::cancel((Canceler *)((long)pointer + 0x1c0),cancelReason);
    Canceler::~Canceler((Canceler *)((long)pointer + 0x1c0));
    *(undefined ***)((long)pointer + 400) = &PTR___cxa_pure_virtual_00431be0;
    if (**(long **)((long)pointer + 0x1a0) == (long)pointer + 400) {
      **(long **)((long)pointer + 0x1a0) = 0;
    }
    NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)((long)pointer + 0x18));
  }
  operator_delete(pointer,0x1c8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }